

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O3

bool Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)0> *Ser,
               ConstQual<GraphicsPipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames
               ,DynamicLinearAllocator *Allocator,ConstQual<const_char_*> *RenderPassName)

{
  bool bVar1;
  
  bVar1 = SerializeCreateInfo(Ser,&CreateInfo->super_PipelineStateCreateInfo,PRSNames,Allocator);
  if ((((bVar1) &&
       (bVar1 = Serializer<(Diligent::SerializerMode)0>::operator()
                          (Ser,&(CreateInfo->GraphicsPipeline).BlendDesc,
                           &(CreateInfo->GraphicsPipeline).SampleMask,
                           &(CreateInfo->GraphicsPipeline).RasterizerDesc,
                           &(CreateInfo->GraphicsPipeline).DepthStencilDesc), bVar1)) &&
      (bVar1 = Serializer<(Diligent::SerializerMode)0>::
               SerializeArray<Diligent::LayoutElement_const*,unsigned_int,Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::GraphicsPipelineStateCreateInfo&,std::array<char_const*,8ul>&,Diligent::DynamicLinearAllocator*,char_const*&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::LayoutElement&)_1_>
                         (Ser,Allocator,&(CreateInfo->GraphicsPipeline).InputLayout,
                          &(CreateInfo->GraphicsPipeline).InputLayout.NumElements), bVar1)) &&
     (bVar1 = Serializer<(Diligent::SerializerMode)0>::Copy<Diligent::PRIMITIVE_TOPOLOGY>
                        (Ser,&(CreateInfo->GraphicsPipeline).PrimitiveTopology,1), bVar1)) {
    bVar1 = Serializer<(Diligent::SerializerMode)0>::operator()
                      (Ser,&(CreateInfo->GraphicsPipeline).NumViewports,
                       &(CreateInfo->GraphicsPipeline).NumRenderTargets,
                       &(CreateInfo->GraphicsPipeline).SubpassIndex,
                       &(CreateInfo->GraphicsPipeline).ShadingRateFlags,
                       &(CreateInfo->GraphicsPipeline).RTVFormats,
                       &(CreateInfo->GraphicsPipeline).DSVFormat,
                       &(CreateInfo->GraphicsPipeline).ReadOnlyDSV,
                       &(CreateInfo->GraphicsPipeline).SmplDesc,RenderPassName);
    return bVar1;
  }
  return false;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                           Ser,
    ConstQual<GraphicsPipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&                       PRSNames,
    DynamicLinearAllocator*                     Allocator,
    ConstQual<const char*>&                     RenderPassName)
{
    if (!SerializeCreateInfo(Ser, static_cast<ConstQual<PipelineStateCreateInfo>&>(CreateInfo), PRSNames, Allocator))
        return false;

    // Serialize GraphicsPipelineDesc
    if (!Ser(CreateInfo.GraphicsPipeline.BlendDesc,
             CreateInfo.GraphicsPipeline.SampleMask,
             CreateInfo.GraphicsPipeline.RasterizerDesc,
             CreateInfo.GraphicsPipeline.DepthStencilDesc))
        return false;

    // Serialize InputLayoutDesc
    {
        auto& InputLayout = CreateInfo.GraphicsPipeline.InputLayout;
        if (!Ser.SerializeArray(Allocator, InputLayout.LayoutElements, InputLayout.NumElements,
                                [](Serializer<Mode>&         Ser,
                                   ConstQual<LayoutElement>& Elem) //
                                {
                                    return Ser(Elem.HLSLSemantic,
                                               Elem.InputIndex,
                                               Elem.BufferSlot,
                                               Elem.NumComponents,
                                               Elem.ValueType,
                                               Elem.IsNormalized,
                                               Elem.RelativeOffset,
                                               Elem.Stride,
                                               Elem.Frequency,
                                               Elem.InstanceDataStepRate);
                                }))
            return false;
    }

    return Ser(CreateInfo.GraphicsPipeline.PrimitiveTopology,
               CreateInfo.GraphicsPipeline.NumViewports,
               CreateInfo.GraphicsPipeline.NumRenderTargets,
               CreateInfo.GraphicsPipeline.SubpassIndex,
               CreateInfo.GraphicsPipeline.ShadingRateFlags,
               CreateInfo.GraphicsPipeline.RTVFormats,
               CreateInfo.GraphicsPipeline.DSVFormat,
               CreateInfo.GraphicsPipeline.ReadOnlyDSV,
               CreateInfo.GraphicsPipeline.SmplDesc,
               RenderPassName); // for CreateInfo.GraphicsPipeline.pRenderPass

    // Skip NodeMask

    ASSERT_SIZEOF64(GraphicsPipelineStateCreateInfo, 344, "Did you add a new member to GraphicsPipelineStateCreateInfo? Please add serialization here.");
    ASSERT_SIZEOF64(LayoutElement, 40, "Did you add a new member to LayoutElement? Please add serialization here.");
}